

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O3

void __thiscall
intel_keym_v2_t::intel_keym_v2_t
          (intel_keym_v2_t *this,kstream *p__io,kstruct *p__parent,intel_keym_v2_t *p__root)

{
  key_signature_t *pkVar1;
  pointer *__ptr;
  
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__intel_keym_v2_t_001aaa30;
  (this->m_reserved)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
  _M_head_impl = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  (this->m_km_hashes)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>
        *)0x0;
  (this->m_key_signature)._M_t.
  super___uniq_ptr_impl<intel_keym_v2_t::key_signature_t,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_keym_v2_t::key_signature_t_*,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
  .super__Head_base<0UL,_intel_keym_v2_t::key_signature_t_*,_false>._M_head_impl =
       (key_signature_t *)0x0;
  this->m__parent = p__parent;
  this->m__root = this;
  (this->m_header)._M_t.
  super___uniq_ptr_impl<intel_keym_v2_t::header_t,_std::default_delete<intel_keym_v2_t::header_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_intel_keym_v2_t::header_t_*,_std::default_delete<intel_keym_v2_t::header_t>_>
  .super__Head_base<0UL,_intel_keym_v2_t::header_t_*,_false>._M_head_impl = (header_t *)0x0;
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_reserved,(pointer)0x0);
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_>_>
           *)&this->m_km_hashes,(pointer)0x0);
  pkVar1 = (this->m_key_signature)._M_t.
           super___uniq_ptr_impl<intel_keym_v2_t::key_signature_t,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_keym_v2_t::key_signature_t_*,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
           .super__Head_base<0UL,_intel_keym_v2_t::key_signature_t_*,_false>._M_head_impl;
  (this->m_key_signature)._M_t.
  super___uniq_ptr_impl<intel_keym_v2_t::key_signature_t,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_keym_v2_t::key_signature_t_*,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
  .super__Head_base<0UL,_intel_keym_v2_t::key_signature_t_*,_false>._M_head_impl =
       (key_signature_t *)0x0;
  if (pkVar1 != (key_signature_t *)0x0) {
    (**(code **)((long)(pkVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  _read(this);
  return;
}

Assistant:

intel_keym_v2_t::intel_keym_v2_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, intel_keym_v2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_header = nullptr;
    m_reserved = nullptr;
    m_km_hashes = nullptr;
    m_key_signature = nullptr;
    _read();
}